

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O3

optional<lambda::Parse_ast> * __thiscall
lambda::parse_from::helper::maybe_parse_term
          (optional<lambda::Parse_ast> *__return_storage_ptr__,helper *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  optional<lambda::Parse_ast> *poVar4;
  optional<lambda::Parse_ast> *extraout_RAX;
  optional<lambda::Parse_ast> *extraout_RAX_00;
  optional<lambda::Parse_ast> *extraout_RAX_01;
  optional<lambda::Parse_ast> *extraout_RAX_02;
  optional<lambda::Parse_ast> *extraout_RAX_03;
  optional<lambda::Parse_ast> *extraout_RAX_04;
  long lVar5;
  _Alloc_hider _Var6;
  string local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  undefined8 local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  string local_140;
  undefined1 local_120 [48];
  undefined1 local_f0 [32];
  unique_ptr<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_> local_d0;
  __index_type local_c8;
  undefined1 local_c0 [40];
  __index_type local_98;
  anon_class_8_1_a78179b7 local_90;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_88;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_58;
  
  while( true ) {
    eat_whitespace(this);
    poVar4 = (optional<lambda::Parse_ast> *)std::istream::peek();
    iVar2 = (int)poVar4;
    if (iVar2 != 0x28) break;
    std::istream::get();
    iVar2 = std::istream::peek();
    if (iVar2 != 0x2a) {
      parse_term((Parse_ast *)local_f0,this);
      goto LAB_00102d73;
    }
    std::istream::get();
    comment(this);
  }
  if (iVar2 < 0x2f) {
    if ((iVar2 == -1) || (iVar2 == 0x29)) {
      (__return_storage_ptr__->super__Optional_base<lambda::Parse_ast,_false,_false>)._M_payload.
      super__Optional_payload<lambda::Parse_ast,_true,_false,_false>.
      super__Optional_payload_base<lambda::Parse_ast>._M_engaged = false;
      return poVar4;
    }
  }
  else if ((iVar2 == 0x2f) || (iVar2 == 0x5c)) {
    std::istream::get();
    parse_from(std::istream&)::helper::get_var_abi_cxx11_((string *)local_120,this);
    while( true ) {
      eat_whitespace(this);
      iVar2 = std::istream::get();
      if (iVar2 != 0x28) break;
      iVar2 = std::istream::peek();
      if (iVar2 != 0x2a) goto LAB_00102ffc;
      std::istream::get();
      comment(this);
    }
    if (iVar2 != 0x2e) {
LAB_00102ffc:
      unexpected_thing((helper *)this->inp);
    }
    std::istream::get();
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_120 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._0_8_ == paVar1) {
      local_140.field_2._8_8_ = local_120._24_8_;
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    }
    else {
      local_140._M_dataplus._M_p = (pointer)local_120._0_8_;
    }
    local_140.field_2._M_allocated_capacity._1_7_ = local_120._17_7_;
    local_140.field_2._M_local_buf[0] = local_120[0x10];
    local_140._M_string_length = local_120._8_8_;
    local_120._8_8_ = 0;
    local_120[0x10] = '\0';
    local_120._0_8_ = paVar1;
    parse_term((Parse_ast *)&local_58,this);
    Parse_ast::Lambda::Lambda((Lambda *)local_f0,&local_140,(Parse_ast *)&local_58);
    std::_Optional_payload_base<lambda::Parse_ast>::_Storage<lambda::Parse_ast,_false>::
    _Storage<lambda::Parse_ast::Lambda>
              ((_Storage<lambda::Parse_ast,_false> *)__return_storage_ptr__,local_f0);
    (__return_storage_ptr__->super__Optional_base<lambda::Parse_ast,_false,_false>)._M_payload.
    super__Optional_payload<lambda::Parse_ast,_true,_false,_false>.
    super__Optional_payload_base<lambda::Parse_ast>._M_engaged = true;
    std::unique_ptr<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>::~unique_ptr
              (&local_d0);
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
    ::~_Variant_storage(&local_58);
    poVar4 = extraout_RAX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      poVar4 = extraout_RAX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._0_8_ == paVar1) {
      return poVar4;
    }
    lVar5 = CONCAT71(local_120._17_7_,local_120[0x10]);
    _Var6._M_p = (pointer)local_120._0_8_;
    goto LAB_00102fe4;
  }
  iVar3 = isalpha(iVar2);
  if ((iVar2 != 0x5f) && (iVar3 == 0)) {
    unexpected_thing((helper *)this->inp);
  }
  parse_from(std::istream&)::helper::get_var_abi_cxx11_(&local_180,this);
  local_c0._8_8_ = local_180._M_string_length;
  paVar1 = &local_180.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p == paVar1) {
    local_150._8_8_ = local_180.field_2._8_8_;
    local_180._M_dataplus._M_p = (pointer)&local_150;
  }
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  local_c0._0_8_ = local_180._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p == &local_150) {
    local_c0._24_8_ = local_150._8_8_;
    local_c0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_c0 + 0x10);
  }
  local_158 = 0;
  local_150._M_allocated_capacity = (ulong)(uint7)local_180.field_2._M_allocated_capacity._1_7_ << 8
  ;
  local_98 = '\0';
  local_180._M_dataplus._M_p = (pointer)paVar1;
  local_160 = &local_150;
  parse_from(std::istream&)::helper::parse_app_list(lambda::Parse_ast_
            ((Parse_ast *)local_f0,this,(Parse_ast *)local_c0);
  std::__detail::__variant::
  _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::_Move_ctor_base((_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                     *)__return_storage_ptr__,
                    (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                     *)local_f0);
  (__return_storage_ptr__->super__Optional_base<lambda::Parse_ast,_false,_false>)._M_payload.
  super__Optional_payload<lambda::Parse_ast,_true,_false,_false>.
  super__Optional_payload_base<lambda::Parse_ast>._M_engaged = true;
  std::__detail::__variant::
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                       *)local_f0);
  std::__detail::__variant::
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                       *)local_c0);
  poVar4 = extraout_RAX_02;
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150._M_allocated_capacity + 1);
    poVar4 = extraout_RAX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p == paVar1) {
    return poVar4;
  }
  lVar5 = CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,local_180.field_2._M_local_buf[0]);
  _Var6._M_p = local_180._M_dataplus._M_p;
LAB_00102fe4:
  operator_delete(_Var6._M_p,lVar5 + 1);
  return extraout_RAX_04;
LAB_00102d73:
  eat_whitespace(this);
  iVar2 = std::istream::get();
  if (iVar2 != 0x28) {
    if (iVar2 == 0x29) {
      std::istream::get();
      local_90.__lhs =
           (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
            *)&local_88;
      local_88._M_index = local_c8;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>_&&>
        ::_S_vtable._M_arr[(long)(char)local_c8 + 1]._M_data)
                (&local_90,
                 (variant<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                  *)local_f0);
      parse_from(std::istream&)::helper::parse_app_list(lambda::Parse_ast_
                ((Parse_ast *)local_120,this,(Parse_ast *)&local_88);
      std::__detail::__variant::
      _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::_Move_ctor_base((_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                         *)__return_storage_ptr__,
                        (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                         *)local_120);
      (__return_storage_ptr__->super__Optional_base<lambda::Parse_ast,_false,_false>)._M_payload.
      super__Optional_payload<lambda::Parse_ast,_true,_false,_false>.
      super__Optional_payload_base<lambda::Parse_ast>._M_engaged = true;
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           *)local_120);
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage(&local_88);
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           *)local_f0);
      return extraout_RAX;
    }
LAB_00103004:
    unexpected_thing((helper *)this->inp);
  }
  iVar2 = std::istream::peek();
  if (iVar2 != 0x2a) goto LAB_00103004;
  std::istream::get();
  comment(this);
  goto LAB_00102d73;
}

Assistant:

std::optional<Parse_ast> maybe_parse_term() {
      eat_whitespace();
      auto ch = inp.peek();
      switch (ch) {
      case eof:
      case ')':
        return std::nullopt;
      case '/':
      case '\\': {
        inp.get();
        auto name = get_var();
        get_dot();
        return Parse_ast::Lambda(std::move(name), parse_term());
      }
      case '(': {
        inp.get();
        if (inp.peek() == '*') {
          inp.get();
          comment();
          return maybe_parse_term();
        }
        auto fst = parse_term();
        get_close_paren();
        return parse_app_list(std::move(fst));
      }
      default:
        if (std::isalpha(ch) or ch == '_') {
          return parse_app_list(Parse_ast::Variable(get_var()));
        } else {
          unexpected_thing();
        }
      }
    }